

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormatLite::
       MessageSize<CoreML::Specification::L2NormalizeLayerParams>(L2NormalizeLayerParams *value)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  lVar4 = (ulong)(value->epsilon_ != 0.0) * 5;
  uVar1 = (value->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    lVar4 = lVar4 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (value->_cached_size_).size_.super___atomic_base<int>._M_i = (uint)lVar4;
  uVar3 = (uint)lVar4 | 1;
  iVar2 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  return (ulong)(iVar2 * 9 + 0x49U >> 6) + lVar4;
}

Assistant:

size_t L2NormalizeLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.L2NormalizeLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // float epsilon = 1;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_epsilon = this->_internal_epsilon();
  uint32_t raw_epsilon;
  memcpy(&raw_epsilon, &tmp_epsilon, sizeof(tmp_epsilon));
  if (raw_epsilon != 0) {
    total_size += 1 + 4;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}